

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::VertexContainer::~VertexContainer(VertexContainer *this)

{
  void *pvVar1;
  long lVar2;
  
  if (this->m_colors != (aiColor4D *)0x0) {
    operator_delete__(this->m_colors);
  }
  for (lVar2 = 0x80; lVar2 != 0xc0; lVar2 = lVar2 + 8) {
    pvVar1 = *(void **)((long)this->m_numUVComps + lVar2 + -0x40);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
  }
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            (&(this->m_normals).
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
  std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
            ((_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this);
  return;
}

Assistant:

OpenGEXImporter::VertexContainer::~VertexContainer() {
    delete[] m_colors;

    for(auto &texcoords : m_textureCoords) {
        delete [] texcoords;
    }
}